

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O3

value * __thiscall docopt::value::operator=(value *this,value *other)

{
  pointer *ppbVar1;
  Kind KVar2;
  pointer pbVar3;
  pointer *local_38;
  size_type sStack_30;
  pointer local_28;
  undefined8 uStack_20;
  
  KVar2 = other->kind;
  switch(KVar2) {
  case Bool:
    local_38 = (pointer *)CONCAT71(local_38._1_7_,(other->variant).boolValue);
    break;
  case Long:
    local_38 = (pointer *)(other->variant).longValue;
    break;
  case String:
    local_38 = &local_28;
    pbVar3 = (other->variant).strList.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pbVar3,
               (long)&(((other->variant).strList.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus)._M_p +
               (long)pbVar3);
    break;
  case StringList:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_38,&(other->variant).strList);
  }
  if (this->kind == StringList) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&(this->variant).strList);
  }
  else if ((this->kind == String) &&
          (pbVar3 = (this->variant).strList.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          pbVar3 != (pointer)((long)&this->variant + 0x10))) {
    operator_delete(pbVar3);
  }
  this->kind = KVar2;
  switch(KVar2) {
  case Bool:
    (this->variant).boolValue = (bool)local_38._0_1_;
    break;
  case Long:
    (this->variant).longValue = (long)local_38;
    break;
  case String:
    ppbVar1 = &(this->variant).strList.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->variant).strList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
    if (local_38 == &local_28) {
      *ppbVar1 = local_28;
      *(undefined8 *)((long)&this->variant + 0x18) = uStack_20;
    }
    else {
      (this->variant).longValue = (long)local_38;
      (this->variant).strList.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_28;
    }
    (this->variant).strValue._M_string_length = sStack_30;
    break;
  case StringList:
    (this->variant).longValue = (long)local_38;
    (this->variant).strValue._M_string_length = sStack_30;
    (this->variant).strList.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_28;
    local_38 = (pointer *)0x0;
    sStack_30 = 0;
    local_28 = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_38);
  }
  return this;
}

Assistant:

inline
	value& value::operator=(value const& other) {
		// make a copy and move from it; way easier.
		return *this = value{other};
	}